

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall State::update(State *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  pointer pBVar8;
  pointer pBVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Ball *c0;
  pointer pBVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar26;
  undefined1 auVar27 [16];
  
  auVar23 = _DAT_00105070;
  auVar24 = _DAT_00105060;
  pBVar8 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fVar16 = this->dt;
  fVar17 = 0.0;
  pBVar15 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pBVar9 = pBVar15; pBVar9 != pBVar8; pBVar9 = pBVar9 + 1) {
    fVar21 = pBVar9->vx;
    fVar19 = pBVar9->vy;
    uVar1 = pBVar9->x;
    uVar5 = pBVar9->y;
    fVar22 = fVar21 * fVar16 + (float)uVar1;
    fVar25 = fVar19 * fVar16 + (float)uVar5;
    pBVar9->x = fVar22;
    pBVar9->y = fVar25;
    fVar20 = pBVar9->vz;
    fVar26 = fVar20 * fVar16 + pBVar9->z;
    pBVar9->z = fVar26;
    fVar18 = pBVar9->r;
    if (fVar22 - fVar18 < -1.0) {
      fVar21 = ABS(fVar21);
      pBVar9->vx = fVar21;
    }
    if (fVar25 - fVar18 < -1.0) {
      fVar19 = ABS(fVar19);
      pBVar9->vy = fVar19;
    }
    if (fVar26 - fVar18 < -1.0) {
      fVar20 = ABS(fVar20);
      pBVar9->vz = fVar20;
    }
    if (1.0 < fVar22 + fVar18) {
      fVar21 = (float)((uint)fVar21 | 0x80000000);
      pBVar9->vx = fVar21;
    }
    if (1.0 < fVar25 + fVar18) {
      fVar19 = (float)((uint)fVar19 | 0x80000000);
      pBVar9->vy = fVar19;
    }
    if (1.0 < fVar18 + fVar26) {
      fVar20 = (float)((uint)fVar20 | 0x80000000);
      pBVar9->vz = fVar20;
    }
    if ((((fVar22 < -2.0) || (fVar25 < -2.0)) || (2.0 < fVar26)) ||
       (((2.0 < fVar25 || (2.0 < fVar22)) || (fVar26 < 2.0)))) {
      auVar27 = maxps(auVar24,CONCAT412(fVar16 * 0.0 + 0.0,
                                        CONCAT48(fVar16 * 0.0 + 0.0,CONCAT44(fVar25,fVar22))));
      auVar27 = minps(auVar23,auVar27);
      pBVar9->x = (float)(int)auVar27._0_8_;
      pBVar9->y = (float)(int)((ulong)auVar27._0_8_ >> 0x20);
      fVar18 = -1.0;
      if (-1.0 <= fVar26) {
        fVar18 = fVar26;
      }
      fVar22 = 1.0;
      if (fVar18 <= 1.0) {
        fVar22 = fVar18;
      }
      pBVar9->z = fVar22;
    }
    fVar17 = fVar17 + (fVar20 * fVar20 + fVar21 * fVar21 + fVar19 * fVar19) * pBVar9->m;
  }
  this->energy = fVar17;
  uVar12 = 1;
  lVar14 = 0x20;
  for (uVar10 = 0; uVar10 < (ulong)((long)pBVar8 - (long)pBVar15 >> 5); uVar10 = uVar10 + 1) {
    c0 = pBVar15 + uVar10;
    lVar13 = lVar14;
    for (uVar11 = uVar12; uVar11 < (ulong)((long)pBVar8 - (long)pBVar15 >> 5); uVar11 = uVar11 + 1)
    {
      fVar16 = dist2(c0,(Ball *)((long)&pBVar15->r + lVar13));
      fVar17 = c0->r + *(float *)((long)&pBVar15->r + lVar13);
      if (fVar16 <= fVar17 * fVar17) {
        fVar17 = c0->z;
        fVar20 = *(float *)((long)&pBVar15->z + lVar13);
        fVar18 = c0->x;
        fVar21 = c0->y;
        uVar4 = *(undefined8 *)((long)&pBVar15->x + lVar13);
        if (fVar16 < 0.0) {
          fVar16 = sqrtf(fVar16);
        }
        else {
          fVar16 = SQRT(fVar16);
        }
        auVar23._0_4_ = fVar18 - (float)uVar4;
        auVar23._4_4_ = fVar21 - (float)((ulong)uVar4 >> 0x20);
        auVar23._8_8_ = 0;
        auVar24._4_4_ = fVar16;
        auVar24._0_4_ = fVar16;
        auVar24._8_4_ = fVar16;
        auVar24._12_4_ = fVar16;
        auVar24 = divps(auVar23,auVar24);
        fVar22 = (fVar17 - fVar20) / fVar16;
        uVar4 = *(undefined8 *)((long)&pBVar15->vx + lVar13);
        fVar17 = *(float *)((long)&pBVar15->vz + lVar13);
        fVar20 = *(float *)((long)&pBVar15->m + lVar13);
        fVar18 = 1.0 / (c0->m + fVar20);
        fVar21 = (float)uVar4;
        fVar19 = (float)((ulong)uVar4 >> 0x20);
        fVar25 = auVar24._0_4_;
        fVar26 = auVar24._4_4_;
        fVar18 = ((c0->vz - fVar17) * fVar22 +
                 (c0->vx - fVar21) * fVar25 + fVar26 * (c0->vy - fVar19)) * (fVar18 + fVar18);
        fVar20 = -fVar20 * fVar18;
        fVar18 = fVar18 * c0->m;
        fVar21 = fVar18 * fVar25 + fVar21;
        fVar19 = fVar18 * fVar26 + fVar19;
        fVar17 = fVar18 * fVar22 + fVar17;
        c0->vx = fVar20 * fVar25 + c0->vx;
        c0->vy = fVar20 * fVar26 + c0->vy;
        c0->vz = fVar20 * fVar22 + c0->vz;
        *(ulong *)((long)&pBVar15->vx + lVar13) = CONCAT44(fVar19,fVar21);
        *(float *)((long)&pBVar15->vz + lVar13) = fVar17;
        uVar2 = c0->vx;
        uVar6 = c0->vy;
        fVar20 = (fVar22 * c0->vz + fVar25 * (float)uVar2 + (float)uVar6 * fVar26) -
                 (fVar22 * fVar17 + fVar25 * fVar21 + fVar19 * fVar26);
        if (1e-05 < ABS(fVar20)) {
          fVar20 = ((*(float *)((long)&pBVar15->r + lVar13) + c0->r) * 1.01 - fVar16) / fVar20;
          uVar3 = c0->x;
          uVar7 = c0->y;
          c0->x = (float)uVar2 * fVar20 + (float)uVar3;
          c0->y = (float)uVar6 * fVar20 + (float)uVar7;
          c0->z = c0->vz * fVar20 + c0->z;
          uVar4 = *(undefined8 *)((long)&pBVar15->x + lVar13);
          *(ulong *)((long)&pBVar15->x + lVar13) =
               CONCAT44(fVar19 * fVar20 + (float)((ulong)uVar4 >> 0x20),
                        fVar21 * fVar20 + (float)uVar4);
          *(float *)((long)&pBVar15->z + lVar13) =
               fVar17 * fVar20 + *(float *)((long)&pBVar15->z + lVar13);
        }
      }
      pBVar15 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar8 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar13 = lVar13 + 0x20;
    }
    uVar12 = uVar12 + 1;
    lVar14 = lVar14 + 0x20;
  }
  this->t = this->dt + this->t;
  return;
}

Assistant:

void update() {
        float energy = 0.0;

        for (auto & ball : balls) {
            ball.x += ball.vx*dt;
            ball.y += ball.vy*dt;
            ball.z += ball.vz*dt;

            if (ball.x - ball.r < -1.0f) ball.vx =  std::abs(ball.vx);
            if (ball.y - ball.r < -1.0f) ball.vy =  std::abs(ball.vy);
            if (ball.z - ball.r < -1.0f) ball.vz =  std::abs(ball.vz);
            if (ball.x + ball.r >  1.0f) ball.vx = -std::abs(ball.vx);
            if (ball.y + ball.r >  1.0f) ball.vy = -std::abs(ball.vy);
            if (ball.z + ball.r >  1.0f) ball.vz = -std::abs(ball.vz);

            if (ball.x < -2.0f || ball.y < -2.0f || ball.z < 2.0f || ball.x > 2.0f || ball.y > 2.0f || ball.z > 2.0f) {
                ball.x = std::max(ball.x, -1.0f);
                ball.x = std::min(ball.x,  1.0f);
                ball.y = std::max(ball.y, -1.0f);
                ball.y = std::min(ball.y,  1.0f);
                ball.z = std::max(ball.z, -1.0f);
                ball.z = std::min(ball.z,  1.0f);
            }

            energy += ball.m*(ball.vx*ball.vx + ball.vy*ball.vy + ball.vz*ball.vz);
        }

        this->energy = energy;

        for (int i = 0; i < balls.size(); ++i) {
            auto & c0 = balls[i];
            for (int j = i + 1; j < balls.size(); ++j) {
                auto & c1 = balls[j];

                float d2 = ::dist2(c0, c1);
                if (d2 > ::dist2(c0.r, c1.r)) continue;

                float nx = c0.x - c1.x;
                float ny = c0.y - c1.y;
                float nz = c0.z - c1.z;
                float d = sqrt(d2);
                nx /= d;
                ny /= d;
                nz /= d;

                float dvx = c0.vx - c1.vx;
                float dvy = c0.vy - c1.vy;
                float dvz = c0.vz - c1.vz;
                float norm = 1.0f/(c0.m + c1.m);

                float p = 2.0f*norm*(dvx*nx + dvy*ny + dvz*nz);
                float vx0 = c0.vx - c1.m*p*nx;
                float vy0 = c0.vy - c1.m*p*ny;
                float vz0 = c0.vz - c1.m*p*nz;
                float vx1 = c1.vx + c0.m*p*nx;
                float vy1 = c1.vy + c0.m*p*ny;
                float vz1 = c1.vz + c0.m*p*nz;

                c0.vx = vx0;
                c0.vy = vy0;
                c0.vz = vz0;
                c1.vx = vx1;
                c1.vy = vy1;
                c1.vz = vz1;

                float l = 1.01f*(c0.r + c1.r) - d;

                float nv0 = c0.vx*nx + c0.vy*ny + c0.vz*nz;
                float nv1 = c1.vx*nx + c1.vy*ny + c1.vz*nz;
                if (std::abs(nv0 - nv1) > 1e-5) {
                    float dt = l/(nv0 - nv1);

                    c0.x += c0.vx*dt;
                    c0.y += c0.vy*dt;
                    c0.z += c0.vz*dt;
                    c1.x += c1.vx*dt;
                    c1.y += c1.vy*dt;
                    c1.z += c1.vz*dt;
                }
            }
        }

        this->t += dt;
    }